

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::BuiltinPrecisionTests::FuncCaseBase::iterate(FuncCaseBase *this)

{
  string *__rhs;
  bool bVar1;
  NotSupportedError *this_00;
  MovePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       glu::ContextInfo::create((this->super_PrecisionCase).m_ctx.renderContext);
  if ((this->super_PrecisionCase).m_extension._M_string_length != 0) {
    __rhs = &(this->super_PrecisionCase).m_extension;
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (info.
                       super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                       m_data.ptr,(__rhs->_M_dataplus)._M_p);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::operator+(&local_38,"Unsupported extension: ",__rhs);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(this->super_PrecisionCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  tcu::ResultCollector::setTestContextResult
            (&(this->super_PrecisionCase).m_status,
             (this->super_PrecisionCase).super_TestCase.super_TestNode.m_testCtx);
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
  return STOP;
}

Assistant:

IterateResult FuncCaseBase::iterate (void)
{
	MovePtr<ContextInfo>	info	(ContextInfo::create(getRenderContext()));

	if (!m_extension.empty() && !info->isExtensionSupported(m_extension.c_str()))
		throw NotSupportedError("Unsupported extension: " + m_extension);

	runTest();

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}